

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.cpp
# Opt level: O2

int __thiscall
btGeneric6DofSpringConstraint::init(btGeneric6DofSpringConstraint *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  
  (this->super_btGeneric6DofConstraint).super_btTypedConstraint.super_btTypedObject.m_objectType = 9
  ;
  for (lVar1 = -6; lVar1 != 0; lVar1 = lVar1 + 1) {
    *(undefined1 *)((long)this->m_equilibriumPoint + lVar1 + -1) = 0;
    this->m_springStiffness[lVar1] = 0.0;
    this->m_springDamping[lVar1] = 0.0;
    this->m_springDamping[lVar1 + 6] = 1.0;
  }
  return 0;
}

Assistant:

void btGeneric6DofSpringConstraint::init()
{
	m_objectType = D6_SPRING_CONSTRAINT_TYPE;

	for(int i = 0; i < 6; i++)
	{
		m_springEnabled[i] = false;
		m_equilibriumPoint[i] = btScalar(0.f);
		m_springStiffness[i] = btScalar(0.f);
		m_springDamping[i] = btScalar(1.f);
	}
}